

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::GatherBase::TestFunction_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  size_type *psVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  ulong *local_30;
  long local_28;
  ulong local_20 [2];
  
  (**(code **)(*this + 0xc0))(&local_30);
  (**(code **)(*this + 200))(&local_50,this);
  uVar4 = 0xf;
  if (local_30 != local_20) {
    uVar4 = local_20[0];
  }
  if (uVar4 < (ulong)(local_48 + local_28)) {
    uVar4 = 0xf;
    if (local_50 != local_40) {
      uVar4 = local_40[0];
    }
    if ((ulong)(local_48 + local_28) <= uVar4) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_30);
      goto LAB_008dd3b6;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_30,(ulong)local_50);
LAB_008dd3b6:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar3 + 2;
  if ((size_type *)*puVar3 == psVar1) {
    uVar2 = puVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::string TestFunction()
	{
		return Sampler() + TextBody();
	}